

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinKrylovDemo_ls.c
# Opt level: O2

int func(N_Vector cc,N_Vector fval,void *user_data)

{
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long local_90;
  
  dVar2 = *(double *)((long)user_data + 0x1c8);
  dVar3 = *(double *)((long)user_data + 0x1d0);
  lVar17 = 0;
  for (lVar11 = 0; lVar11 != 5; lVar11 = lVar11 + 1) {
    lVar1 = lVar17 + 0xf0;
    lVar14 = lVar1;
    if (lVar11 == 4) {
      lVar14 = lVar17 + -0xf0;
    }
    local_90 = lVar17 + -0xf0;
    if (lVar11 == 0) {
      local_90 = lVar1;
    }
    for (lVar16 = 0; lVar16 != 5; lVar16 = lVar16 + 1) {
      lVar5 = *(long *)((long)cc->content + 0x10);
      lVar10 = lVar16 * 6 + lVar11 * 0x1e;
      lVar6 = *(long *)(**(long **)((long)user_data + 0x1a0) + 0x10);
      lVar7 = *(long *)((long)fval->content + 0x10);
      WebRate((double)(int)lVar16 * dVar2,(double)(int)lVar11 * dVar3,
              (sunrealtype *)(lVar10 * 8 + lVar5),(sunrealtype *)(lVar6 + lVar10 * 8),user_data);
      lVar10 = lVar17 + 0x30;
      lVar13 = lVar10;
      if (lVar16 == 4) {
        lVar13 = lVar17 + -0x30;
      }
      lVar8 = *(long *)((long)user_data + 0x1a8);
      lVar9 = *(long *)((long)user_data + 0x1b0);
      lVar12 = lVar17 + -0x30;
      if (lVar16 == 0) {
        lVar12 = lVar10;
      }
      for (lVar15 = 0; lVar15 != 0x30; lVar15 = lVar15 + 8) {
        dVar4 = *(double *)(lVar5 + lVar17 + lVar15);
        *(double *)(lVar7 + lVar17 + lVar15) =
             ((*(double *)(lVar14 + lVar5 + lVar15) - dVar4) -
             (dVar4 - *(double *)(local_90 + lVar5 + lVar15))) * *(double *)(lVar9 + lVar15) +
             ((*(double *)(lVar13 + lVar5 + lVar15) - dVar4) -
             (dVar4 - *(double *)(lVar12 + lVar5 + lVar15))) * *(double *)(lVar8 + lVar15) +
             *(double *)(lVar6 + lVar17 + lVar15);
      }
      lVar14 = lVar14 + 0x30;
      local_90 = local_90 + 0x30;
      lVar17 = lVar10;
    }
    lVar17 = lVar1;
  }
  return 0;
}

Assistant:

static int func(N_Vector cc, N_Vector fval, void* user_data)
{
  sunrealtype xx, yy, delx, dely, *cxy, *rxy, *fxy, dcyli, dcyui, dcxli, dcxri;
  int jx, jy, is, idyu, idyl, idxr, idxl;
  UserData data;

  data = (UserData)user_data;
  delx = data->dx;
  dely = data->dy;

  /* Loop over all mesh points, evaluating rate array at each point*/
  for (jy = 0; jy < MY; jy++)
  {
    yy = dely * jy;

    /* Set lower/upper index shifts, special at boundaries. */
    idyl = (jy != 0) ? NSMX : -NSMX;
    idyu = (jy != MY - 1) ? NSMX : -NSMX;

    for (jx = 0; jx < MX; jx++)
    {
      xx = delx * jx;

      /* Set left/right index shifts, special at boundaries. */
      idxl = (jx != 0) ? NUM_SPECIES : -NUM_SPECIES;
      idxr = (jx != MX - 1) ? NUM_SPECIES : -NUM_SPECIES;

      cxy = IJ_Vptr(cc, jx, jy);
      rxy = IJ_Vptr(data->rates, jx, jy);
      fxy = IJ_Vptr(fval, jx, jy);

      /* Get species interaction rate array at (xx,yy) */
      WebRate(xx, yy, cxy, rxy, user_data);

      for (is = 0; is < NUM_SPECIES; is++)
      {
        /* Differencing in x direction */
        dcyli = *(cxy + is) - *(cxy - idyl + is);
        dcyui = *(cxy + idyu + is) - *(cxy + is);

        /* Differencing in y direction */
        dcxli = *(cxy + is) - *(cxy - idxl + is);
        dcxri = *(cxy + idxr + is) - *(cxy + is);

        /* Compute the total rate value at (xx,yy) */
        fxy[is] = (coy)[is] * (dcyui - dcyli) + (cox)[is] * (dcxri - dcxli) +
                  rxy[is];

      } /* end of is loop */

    } /* end of jx loop */

  } /* end of jy loop */

  return (0);
}